

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraint.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31bae::TestTimeConstraintFailsWithSlowTest::RunImpl
          (TestTimeConstraintFailsWithSlowTest *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_b0;
  int local_8c [5];
  TestDetails local_78;
  undefined1 local_58 [8];
  TimeConstraint t;
  ScopedCurrentTest scopedResult;
  TestResults result;
  TestTimeConstraintFailsWithSlowTest *this_local;
  
  UnitTest::TestResults::TestResults
            ((TestResults *)&scopedResult.m_oldTestDetails,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)&t.m_maxMs,(TestResults *)&scopedResult.m_oldTestDetails,
             (TestDetails *)0x0);
  UnitTest::TestDetails::TestDetails(&local_78,"","","",0);
  UnitTest::TimeConstraint::TimeConstraint((TimeConstraint *)local_58,10,&local_78);
  UnitTest::TimeHelpers::SleepMs(0x14);
  UnitTest::TimeConstraint::~TimeConstraint((TimeConstraint *)local_58);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)&t.m_maxMs);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_8c[1] = 1;
  local_8c[0] = UnitTest::TestResults::GetFailureCount
                          ((TestResults *)&scopedResult.m_oldTestDetails);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar2,0x1f);
  UnitTest::CheckEqual<int,int>(results,local_8c + 1,local_8c,&local_b0);
  return;
}

Assistant:

TEST(TimeConstraintFailsWithSlowTest)
{
    TestResults result;
    {
		ScopedCurrentTest scopedResult(result);
        TimeConstraint t(10, TestDetails("", "", "", 0));
        TimeHelpers::SleepMs(20);
    }
    CHECK_EQUAL(1, result.GetFailureCount());
}